

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void __thiscall loguru::LogScopeRAII::~LogScopeRAII(LogScopeRAII *this)

{
  Verbosity verbosity;
  uint line;
  char *file;
  bool bVar1;
  __int_type _Var2;
  reference pCVar3;
  longlong lVar4;
  char *buff_00;
  Text local_48;
  Text buff;
  double duration_sec;
  Callback *p;
  iterator __end2;
  iterator __begin2;
  CallbackVec *__range2;
  lock_guard<std::recursive_mutex> lock;
  LogScopeRAII *this_local;
  
  if (this->_file != (char *)0x0) {
    lock._M_device = (mutex_type *)this;
    std::lock_guard<std::recursive_mutex>::lock_guard
              ((lock_guard<std::recursive_mutex> *)&__range2,(mutex_type *)s_mutex);
    if (((this->_indent_stderr & 1U) != 0) &&
       (_Var2 = std::__atomic_base::operator_cast_to_unsigned_int
                          ((__atomic_base *)&s_stderr_indentation), _Var2 != 0)) {
      std::__atomic_base<unsigned_int>::operator--
                ((__atomic_base<unsigned_int> *)&s_stderr_indentation);
    }
    __end2 = std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::begin
                       ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
    p = (Callback *)
        std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::end
                  ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
                                       *)&p), bVar1) {
      pCVar3 = __gnu_cxx::
               __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
               ::operator*(&__end2);
      if ((this->_verbosity <= pCVar3->verbosity) && (pCVar3->indentation != 0)) {
        pCVar3->indentation = pCVar3->indentation - 1;
      }
      __gnu_cxx::
      __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
      ::operator++(&__end2);
    }
    lVar4 = now_ns();
    buff._str = (char *)((double)(lVar4 - this->_start_time_ns) / 1000000000.0);
    textprintf((char *)&local_48,buff._str,"%.*f s: %s",3,this->_name);
    verbosity = this->_verbosity;
    file = this->_file;
    line = this->_line;
    buff_00 = Text::c_str(&local_48);
    log_to_everywhere(1,verbosity,file,line,"} ",buff_00);
    Text::~Text(&local_48);
    std::lock_guard<std::recursive_mutex>::~lock_guard
              ((lock_guard<std::recursive_mutex> *)&__range2);
  }
  return;
}

Assistant:

LogScopeRAII::~LogScopeRAII()
	{
		if (_file) {
			std::lock_guard<std::recursive_mutex> lock(s_mutex);
			if (_indent_stderr && s_stderr_indentation > 0) {
				--s_stderr_indentation;
			}
			for (auto& p : s_callbacks) {
				// Note: Callback indentation cannot change!
				if (_verbosity <= p.verbosity) {
					// in unlikely case this callback is new
					if (p.indentation > 0) {
						--p.indentation;
					}
				}
			}
#if LOGURU_VERBOSE_SCOPE_ENDINGS
			auto duration_sec = (now_ns() - _start_time_ns) / 1e9;
			auto buff = textprintf("%.*f s: %s", LOGURU_SCOPE_TIME_PRECISION, duration_sec, _name);
			log_to_everywhere(1, _verbosity, _file, _line, "} ", buff.c_str());
#else
			log_to_everywhere(1, _verbosity, _file, _line, "}", "");
#endif
		}
	}